

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O3

bool __thiscall slang::ast::Expression::isImplicitString(Expression *this)

{
  ExpressionKind EVar1;
  Type *pTVar2;
  bool bVar3;
  Type *pTVar4;
  MinTypMaxExpression *mtm;
  long lVar5;
  long lVar6;
  bool bVar7;
  
  do {
    pTVar2 = (this->type).ptr;
    pTVar4 = pTVar2->canonical;
    if (pTVar4 == (Type *)0x0) {
      Type::resolveCanonical(pTVar2);
      pTVar4 = pTVar2->canonical;
    }
    if ((pTVar4->super_Symbol).kind == StringType) {
      return true;
    }
    EVar1 = this->kind;
    lVar5 = 0x38;
    switch(EVar1) {
    case StringLiteral:
      return true;
    case NamedValue:
      if (((*(ParameterSymbol **)(this + 1))->super_ValueSymbol).super_Symbol.kind != Parameter) {
        return false;
      }
      bVar3 = ParameterSymbol::isImplicitString(*(ParameterSymbol **)(this + 1),this->sourceRange);
      return bVar3;
    case HierarchicalValue:
    case Inside:
    case Assignment:
    case Streaming:
    case ElementSelect:
    case RangeSelect:
    case MemberAccess:
    case Call:
      return false;
    case UnaryOp:
      lVar5 = 0x48;
      break;
    case BinaryOp:
      bVar3 = isImplicitString(*(Expression **)(this + 1));
      goto LAB_002263f4;
    case ConditionalOp:
      bVar3 = isImplicitString((Expression *)this[1].syntax);
      lVar5 = 0x50;
LAB_002263f4:
      if (bVar3 != false) {
        return true;
      }
      break;
    case Concatenation:
      pTVar2 = this[1].type.ptr;
      if (pTVar2 == (Type *)0x0) {
        return false;
      }
      lVar5 = *(long *)(this + 1);
      lVar6 = 0;
      do {
        bVar3 = isImplicitString(*(Expression **)(lVar5 + lVar6));
        if (bVar3) {
          return bVar3;
        }
        bVar7 = (long)pTVar2 * 8 + -8 != lVar6;
        lVar6 = lVar6 + 8;
      } while (bVar7);
      return bVar3;
    case Replication:
      break;
    case Conversion:
      if (1 < (int)this[1].kind) {
        return false;
      }
      break;
    default:
      if (EVar1 == ValueRange) {
        bVar3 = isImplicitString((Expression *)this[1].type.ptr);
        if (bVar3) {
          return true;
        }
        lVar5 = 0x40;
        if (this[1].kind != Invalid) {
          return false;
        }
      }
      else {
        if (EVar1 != MinTypMax) {
          return false;
        }
        lVar5 = 0x30;
      }
    }
    this = *(Expression **)((long)&this->kind + lVar5);
  } while( true );
}

Assistant:

bool Expression::isImplicitString() const {
    if (type->isString())
        return true;

    switch (kind) {
        case ExpressionKind::StringLiteral:
            return true;
        case ExpressionKind::UnaryOp:
            return as<UnaryExpression>().operand().isImplicitString();
        case ExpressionKind::BinaryOp: {
            auto& op = as<BinaryExpression>();
            return op.left().isImplicitString() || op.right().isImplicitString();
        }
        case ExpressionKind::ConditionalOp: {
            auto& op = as<ConditionalExpression>();
            return op.left().isImplicitString() || op.right().isImplicitString();
        }
        case ExpressionKind::Concatenation: {
            auto& concat = as<ConcatenationExpression>();
            for (auto op : concat.operands()) {
                if (op->isImplicitString())
                    return true;
            }
            return false;
        }
        case ExpressionKind::Replication: {
            auto& repl = as<ReplicationExpression>();
            return repl.concat().isImplicitString();
        }
        case ExpressionKind::ValueRange: {
            auto& range = as<ValueRangeExpression>();
            return range.left().isImplicitString() ||
                   (range.rangeKind == ValueRangeKind::Simple && range.right().isImplicitString());
        }
        case ExpressionKind::MinTypMax: {
            auto& mtm = as<MinTypMaxExpression>();
            return mtm.selected().isImplicitString();
        }
        case ExpressionKind::NamedValue: {
            auto& nv = as<NamedValueExpression>();
            return nv.symbol.kind == SymbolKind::Parameter &&
                   nv.symbol.as<ParameterSymbol>().isImplicitString(sourceRange);
        }
        case ExpressionKind::Conversion: {
            auto& conv = as<ConversionExpression>();
            return conv.isImplicit() && conv.operand().isImplicitString();
        }
        default:
            return false;
    }
}